

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

string * google::protobuf::compiler::php::anon_unknown_2::
         GeneratedClassNameImpl<google::protobuf::EnumDescriptor>
                   (string *__return_storage_ptr__,EnumDescriptor *desc)

{
  EnumDescriptor *pEVar1;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ClassNamePrefix<google::protobuf::EnumDescriptor>(&local_b0,*(string **)(desc + 8),desc);
  std::operator+(__return_storage_ptr__,&local_b0,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(desc + 8));
  std::__cxx11::string::~string((string *)&local_b0);
  pEVar1 = desc;
  while (pEVar1 = *(EnumDescriptor **)(pEVar1 + 0x18), pEVar1 != (EnumDescriptor *)0x0) {
    ClassNamePrefix<google::protobuf::EnumDescriptor>(&local_90,*(string **)(pEVar1 + 8),desc);
    std::operator+(&local_70,&local_90,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (pEVar1 + 8));
    std::operator+(&local_50,&local_70,'\\');
    std::operator+(&local_b0,&local_50,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratedClassNameImpl(const DescriptorType* desc) {
  std::string classname = ClassNamePrefix(desc->name(), desc) + desc->name();
  const Descriptor* containing = desc->containing_type();
  while (containing != NULL) {
    classname = ClassNamePrefix(containing->name(), desc) + containing->name()
       + '\\' + classname;
    containing = containing->containing_type();
  }
  return classname;
}